

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::Type::Type(Type *this,initializer_list<wasm::Type> types)

{
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_38;
  allocator_type local_19;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_38,types,&local_19);
  Type(this,(Tuple *)&local_38);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

Type::Type(std::initializer_list<Type> types) : Type(Tuple(types)) {}